

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  Bool is_last_block_local;
  EState *s_local;
  
  if (0 < s->nblock) {
    s->blockCRC = s->blockCRC ^ 0xffffffff;
    s->combinedCRC = s->combinedCRC << 1 | s->combinedCRC >> 0x1f;
    s->combinedCRC = s->blockCRC ^ s->combinedCRC;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n",
              (ulong)(uint)s->blockNo,(ulong)s->blockCRC,(ulong)s->combinedCRC,
              (ulong)(uint)s->nblock);
    }
    BZ2_blockSort(s);
  }
  s->zbits = (UChar *)((long)s->arr2 + (long)s->nblock);
  if (s->blockNo == 1) {
    BZ2_bsInitWrite(s);
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
  }
  if (0 < s->nblock) {
    bsPutUChar(s,'1');
    bsPutUChar(s,'A');
    bsPutUChar(s,'Y');
    bsPutUChar(s,'&');
    bsPutUChar(s,'S');
    bsPutUChar(s,'Y');
    bsPutUInt32(s,s->blockCRC);
    bsW(s,1,0);
    bsW(s,0x18,s->origPtr);
    generateMTFValues(s);
    sendMTFValues(s);
  }
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      fprintf(_stderr,"    final combined CRC = 0x%08x\n   ",(ulong)s->combinedCRC);
    }
    bsFinishWrite(s);
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}